

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create_table.cpp
# Opt level: O2

vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
* __thiscall
duckdb::Binder::BindNewConstraints
          (vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
           *__return_storage_ptr__,Binder *this,
          vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
          *constraints,string *table_name,ColumnList *columns)

{
  pointer puVar1;
  bool bVar2;
  pointer pPVar3;
  pointer pBVar4;
  BoundUniqueConstraint *pBVar5;
  BoundNotNullConstraint *pBVar6;
  size_type sVar7;
  ParserException *this_00;
  pointer __k;
  pointer this_01;
  _Head_base<0UL,_duckdb::BoundConstraint_*,_false> local_f0;
  BoundConstraint *local_e8;
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,std::default_delete<duckdb::BoundConstraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,std::default_delete<duckdb::BoundConstraint>,true>>>
  *local_e0;
  string *local_d8;
  ColumnList *local_d0;
  vector<duckdb::PhysicalIndex,_true> primary_keys;
  LogicalIndex logical_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  physical_index_set_t not_null_columns;
  
  local_d8 = table_name;
  local_d0 = columns;
  BindConstraints(__return_storage_ptr__,this,constraints,table_name,columns);
  not_null_columns._M_h._M_buckets = &not_null_columns._M_h._M_single_bucket;
  not_null_columns._M_h._M_bucket_count = 1;
  not_null_columns._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  not_null_columns._M_h._M_element_count = 0;
  not_null_columns._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  not_null_columns._M_h._M_rehash_policy._M_next_resize = 0;
  not_null_columns._M_h._M_single_bucket = (__node_base_ptr)0x0;
  primary_keys.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  primary_keys.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  primary_keys.super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_01 = (__return_storage_ptr__->
            super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (__return_storage_ptr__->
           super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar2 = false;
  local_e0 = (vector<duckdb::unique_ptr<duckdb::BoundConstraint,std::default_delete<duckdb::BoundConstraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,std::default_delete<duckdb::BoundConstraint>,true>>>
              *)__return_storage_ptr__;
  do {
    pPVar3 = primary_keys.
             super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
             super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (this_01 == puVar1) {
      if (bVar2) {
        for (__k = primary_keys.
                   super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                   super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                   ._M_impl.super__Vector_impl_data._M_start; __k != pPVar3; __k = __k + 1) {
          sVar7 = ::std::
                  _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::count(&not_null_columns._M_h,__k);
          if (sVar7 == 0) {
            logical_index = ColumnList::PhysicalToLogical(local_d0,__k->index);
            make_uniq<duckdb::NotNullConstraint,duckdb::LogicalIndex&>
                      ((duckdb *)&local_e8,&logical_index);
            local_f0._M_head_impl = local_e8;
            local_e8 = (BoundConstraint *)0x0;
            ::std::
            vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                        *)constraints,
                       (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                        *)&local_f0);
            if (local_f0._M_head_impl != (BoundConstraint *)0x0) {
              (*(local_f0._M_head_impl)->_vptr_BoundConstraint[1])();
            }
            local_f0._M_head_impl = (BoundConstraint *)0x0;
            if (local_e8 != (BoundConstraint *)0x0) {
              (*local_e8->_vptr_BoundConstraint[1])();
            }
            make_uniq<duckdb::BoundNotNullConstraint,duckdb::PhysicalIndex&>
                      ((duckdb *)&local_e8,__k);
            local_f0._M_head_impl = local_e8;
            local_e8 = (BoundConstraint *)0x0;
            ::std::
            vector<duckdb::unique_ptr<duckdb::BoundConstraint,std::default_delete<duckdb::BoundConstraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,std::default_delete<duckdb::BoundConstraint>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::BoundConstraint,std::default_delete<duckdb::BoundConstraint>,true>>
                      (local_e0,(unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
                                 *)&local_f0);
            if (local_f0._M_head_impl != (BoundConstraint *)0x0) {
              (*(local_f0._M_head_impl)->_vptr_BoundConstraint[1])();
            }
            local_f0._M_head_impl = (BoundConstraint *)0x0;
            if (local_e8 != (BoundConstraint *)0x0) {
              (*local_e8->_vptr_BoundConstraint[1])();
            }
          }
        }
      }
      ::std::_Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::
      ~_Vector_base((_Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> *)
                    &primary_keys);
      ::std::
      _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&not_null_columns._M_h);
      return (vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
              *)local_e0;
    }
    pBVar4 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
             ::operator->(this_01);
    if (pBVar4->type == NOT_NULL) {
      pBVar4 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
               ::operator->(this_01);
      pBVar6 = BoundConstraint::Cast<duckdb::BoundNotNullConstraint>(pBVar4);
      ::std::__detail::
      _Insert_base<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&not_null_columns,&pBVar6->index);
    }
    else if (pBVar4->type == UNIQUE) {
      pBVar4 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
               ::operator->(this_01);
      pBVar5 = BoundConstraint::Cast<duckdb::BoundUniqueConstraint>(pBVar4);
      if (pBVar5->is_primary_key == true) {
        if (bVar2) {
          this_00 = (ParserException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&logical_index,"table \"%s\" has more than one primary key",
                     (allocator *)&local_f0);
          ::std::__cxx11::string::string((string *)&local_88,(string *)local_d8);
          ParserException::ParserException<std::__cxx11::string>
                    (this_00,(string *)&logical_index,&local_88);
          __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        bVar2 = true;
        ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::operator=
                  (&primary_keys.
                    super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>,
                   &(pBVar5->keys).
                    super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>);
      }
    }
    this_01 = this_01 + 1;
  } while( true );
}

Assistant:

vector<unique_ptr<BoundConstraint>> Binder::BindNewConstraints(vector<unique_ptr<Constraint>> &constraints,
                                                               const string &table_name, const ColumnList &columns) {
	auto bound_constraints = BindConstraints(constraints, table_name, columns);

	// Handle PK and NOT NULL constraints.
	bool has_primary_key = false;
	physical_index_set_t not_null_columns;
	vector<PhysicalIndex> primary_keys;

	for (const auto &bound_constr : bound_constraints) {
		switch (bound_constr->type) {
		case ConstraintType::NOT_NULL: {
			auto &not_null = bound_constr->Cast<BoundNotNullConstraint>();
			not_null_columns.insert(not_null.index);
			break;
		}
		case ConstraintType::UNIQUE: {
			const auto &unique = bound_constr->Cast<BoundUniqueConstraint>();
			if (unique.is_primary_key) {
				if (has_primary_key) {
					throw ParserException("table \"%s\" has more than one primary key", table_name);
				}
				has_primary_key = true;
				primary_keys = unique.keys;
			}
			break;
		}
		default:
			break;
		}
	}

	if (has_primary_key) {
		// Create a PK constraint, and a NOT NULL constraint for each indexed column.
		for (auto &column_index : primary_keys) {
			if (not_null_columns.count(column_index) != 0) {
				continue;
			}

			auto logical_index = columns.PhysicalToLogical(column_index);
			constraints.push_back(make_uniq<NotNullConstraint>(logical_index));
			bound_constraints.push_back(make_uniq<BoundNotNullConstraint>(column_index));
		}
	}

	return bound_constraints;
}